

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O1

void __thiscall
jaegertracing::sampling_manager::thrift::PerOperationSamplingStrategies::write
          (PerOperationSamplingStrategies *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  write((PerOperationSamplingStrategies *)(&this->field_0x0 + *(long *)(*(long *)this + -0x28)),
        in_ESI,in_RDX,in_RCX);
  return;
}

Assistant:

uint32_t PerOperationSamplingStrategies::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("PerOperationSamplingStrategies");

  xfer += oprot->writeFieldBegin("defaultSamplingProbability", ::apache::thrift::protocol::T_DOUBLE, 1);
  xfer += oprot->writeDouble(this->defaultSamplingProbability);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("defaultLowerBoundTracesPerSecond", ::apache::thrift::protocol::T_DOUBLE, 2);
  xfer += oprot->writeDouble(this->defaultLowerBoundTracesPerSecond);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("perOperationStrategies", ::apache::thrift::protocol::T_LIST, 3);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->perOperationStrategies.size()));
    std::vector<OperationSamplingStrategy> ::const_iterator _iter11;
    for (_iter11 = this->perOperationStrategies.begin(); _iter11 != this->perOperationStrategies.end(); ++_iter11)
    {
      xfer += (*_iter11).write(oprot);
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  if (this->__isset.defaultUpperBoundTracesPerSecond) {
    xfer += oprot->writeFieldBegin("defaultUpperBoundTracesPerSecond", ::apache::thrift::protocol::T_DOUBLE, 4);
    xfer += oprot->writeDouble(this->defaultUpperBoundTracesPerSecond);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}